

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O0

int anon_unknown.dwarf_fc70::RtMidiIn_ignoretypes(lua_State *L)

{
  int iVar1;
  int iVar2;
  int iVar3;
  RtMidiIn *this;
  bool midiSense;
  bool midiTime;
  bool midiSysex;
  RtMidiIn *self;
  lua_State *L_local;
  
  this = getRtMidiIn(L,1);
  iVar1 = lua_toboolean(L,2);
  iVar2 = lua_toboolean(L,3);
  iVar3 = lua_toboolean(L,4);
  RtMidiIn::ignoreTypes(this,iVar1 != 0,iVar2 != 0,iVar3 != 0);
  return 0;
}

Assistant:

int RtMidiIn_ignoretypes(lua_State *L) {
	auto &self = getRtMidiIn(L, 1);
	bool midiSysex = lua_toboolean(L, 2);
	bool midiTime = lua_toboolean(L, 3);
	bool midiSense = lua_toboolean(L, 4);
	self.ignoreTypes(midiSysex, midiTime, midiSense);
	return 0;
}